

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins.cpp
# Opt level: O2

bool __thiscall CCoinsView::HaveCoin(CCoinsView *this,COutPoint *outpoint)

{
  int iVar1;
  long in_FS_OFFSET;
  Coin coin;
  Coin local_50;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  Coin::Coin(&local_50);
  iVar1 = (**this->_vptr_CCoinsView)(this,outpoint,&local_50);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            (&local_50.out.scriptPubKey.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return SUB41(iVar1,0);
  }
  __stack_chk_fail();
}

Assistant:

bool CCoinsView::HaveCoin(const COutPoint &outpoint) const
{
    Coin coin;
    return GetCoin(outpoint, coin);
}